

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmorpher.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_16ca7c::VmorpherState::deviceUpdate(VmorpherState *this,ALCdevice *param_2)

{
  _Mem_fn<void_((anonymous_namespace)::FormantFilter::*)()> __f;
  _Mem_fn<void_((anonymous_namespace)::FormantFilter::*)()> __f_00;
  FormantFilter *__first;
  FormantFilter *__first_00;
  long in_RDI;
  anon_struct_256_3_bb3a4c3d *e;
  anon_struct_256_3_bb3a4c3d *__end1;
  anon_struct_256_3_bb3a4c3d *__begin1;
  anon_struct_256_3_bb3a4c3d (*__range1) [16];
  code *__pm;
  FormantFilter (*local_20) [4];
  
  for (local_20 = (FormantFilter (*) [4])(in_RDI + 0x20);
      local_20 != (FormantFilter (*) [4])(in_RDI + 0x1020); local_20 = local_20 + 4) {
    __first = std::begin<(anonymous_namespace)::FormantFilter,4ul>(local_20);
    __first_00 = std::end<(anonymous_namespace)::FormantFilter,4ul>(local_20);
    __pm = FormantFilter::clear;
    std::mem_fn<void(),(anonymous_namespace)::FormantFilter>(0x1eadf0);
    __f.super__Mem_fn_base<void_((anonymous_namespace)::FormantFilter::*)(),_true>._8_8_ = __pm;
    __f.super__Mem_fn_base<void_((anonymous_namespace)::FormantFilter::*)(),_true>._M_pmf =
         (offset_in_FormantFilter_to_subr)__first_00;
    std::
    for_each<(anonymous_namespace)::FormantFilter*,std::_Mem_fn<void((anonymous_namespace)::FormantFilter::*)()>>
              (__first,(FormantFilter *)0x1ea277,__f);
    std::begin<(anonymous_namespace)::FormantFilter,4ul>(local_20 + 1);
    std::end<(anonymous_namespace)::FormantFilter,4ul>(local_20 + 1);
    std::mem_fn<void(),(anonymous_namespace)::FormantFilter>((offset_in_FormantFilter_to_subr)__pm);
    __f_00.super__Mem_fn_base<void_((anonymous_namespace)::FormantFilter::*)(),_true>._8_8_ = __pm;
    __f_00.super__Mem_fn_base<void_((anonymous_namespace)::FormantFilter::*)(),_true>._M_pmf =
         (offset_in_FormantFilter_to_subr)__first_00;
    std::
    for_each<(anonymous_namespace)::FormantFilter*,std::_Mem_fn<void((anonymous_namespace)::FormantFilter::*)()>>
              (__first,(FormantFilter *)0x1ea2f5,__f_00);
    std::begin<float,16ul>((float (*) [16])(local_20 + 2));
    std::end<float,16ul>((float (*) [16])(local_20 + 2));
    std::fill<float*,float>(&__first_00->mCoeff,&__first->mCoeff,(float *)0x1ea347);
  }
  return;
}

Assistant:

void VmorpherState::deviceUpdate(const ALCdevice* /*device*/)
{
    for(auto &e : mChans)
    {
        std::for_each(std::begin(e.Formants[VOWEL_A_INDEX]), std::end(e.Formants[VOWEL_A_INDEX]),
            std::mem_fn(&FormantFilter::clear));
        std::for_each(std::begin(e.Formants[VOWEL_B_INDEX]), std::end(e.Formants[VOWEL_B_INDEX]),
            std::mem_fn(&FormantFilter::clear));
        std::fill(std::begin(e.CurrentGains), std::end(e.CurrentGains), 0.0f);
    }
}